

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walIndexAppend(Wal *pWal,u32 iFrame,u32 iPage)

{
  int iVar1;
  int local_44;
  int nByte;
  int nCollide;
  int idx;
  int iKey;
  ht_slot *aHash;
  u32 *aPgno;
  u32 iZero;
  int rc;
  u32 iPage_local;
  u32 iFrame_local;
  Wal *pWal_local;
  
  aPgno._0_4_ = 0;
  aHash = (ht_slot *)0x0;
  _idx = (ht_slot *)0x0;
  iZero = iPage;
  rc = iFrame;
  _iPage_local = pWal;
  iVar1 = walFramePage(iFrame);
  aPgno._4_4_ = walHashGet(pWal,iVar1,(ht_slot **)&idx,(u32 **)&aHash,(u32 *)&aPgno);
  if (aPgno._4_4_ == 0) {
    iVar1 = rc - (int)aPgno;
    if (iVar1 == 1) {
      memset(aHash + 2,0,(long)(((int)_idx + 0x4000) - ((int)aHash + 4)));
    }
    if (*(int *)(aHash + (long)iVar1 * 2) != 0) {
      walCleanupHash(_iPage_local);
    }
    nCollide = walHash(iZero);
    local_44 = iVar1;
    while (_idx[nCollide] != 0) {
      if (local_44 == 0) {
        iVar1 = sqlite3CorruptError(0xdae8);
        return iVar1;
      }
      nCollide = walNextHash(nCollide);
      local_44 = local_44 + -1;
    }
    *(u32 *)(aHash + (long)iVar1 * 2) = iZero;
    _idx[nCollide] = (ht_slot)iVar1;
  }
  return aPgno._4_4_;
}

Assistant:

static int walIndexAppend(Wal *pWal, u32 iFrame, u32 iPage){
  int rc;                         /* Return code */
  u32 iZero = 0;                  /* One less than frame number of aPgno[1] */
  volatile u32 *aPgno = 0;        /* Page number array */
  volatile ht_slot *aHash = 0;    /* Hash table */

  rc = walHashGet(pWal, walFramePage(iFrame), &aHash, &aPgno, &iZero);

  /* Assuming the wal-index file was successfully mapped, populate the
  ** page number array and hash table entry.
  */
  if( rc==SQLITE_OK ){
    int iKey;                     /* Hash table key */
    int idx;                      /* Value to write to hash-table slot */
    int nCollide;                 /* Number of hash collisions */

    idx = iFrame - iZero;
    assert( idx <= HASHTABLE_NSLOT/2 + 1 );
    
    /* If this is the first entry to be added to this hash-table, zero the
    ** entire hash table and aPgno[] array before proceeding. 
    */
    if( idx==1 ){
      int nByte = (int)((u8 *)&aHash[HASHTABLE_NSLOT] - (u8 *)&aPgno[1]);
      memset((void*)&aPgno[1], 0, nByte);
    }

    /* If the entry in aPgno[] is already set, then the previous writer
    ** must have exited unexpectedly in the middle of a transaction (after
    ** writing one or more dirty pages to the WAL to free up memory). 
    ** Remove the remnants of that writers uncommitted transaction from 
    ** the hash-table before writing any new entries.
    */
    if( aPgno[idx] ){
      walCleanupHash(pWal);
      assert( !aPgno[idx] );
    }

    /* Write the aPgno[] array entry and the hash-table slot. */
    nCollide = idx;
    for(iKey=walHash(iPage); aHash[iKey]; iKey=walNextHash(iKey)){
      if( (nCollide--)==0 ) return SQLITE_CORRUPT_BKPT;
    }
    aPgno[idx] = iPage;
    aHash[iKey] = (ht_slot)idx;

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
    /* Verify that the number of entries in the hash table exactly equals
    ** the number of entries in the mapping region.
    */
    {
      int i;           /* Loop counter */
      int nEntry = 0;  /* Number of entries in the hash table */
      for(i=0; i<HASHTABLE_NSLOT; i++){ if( aHash[i] ) nEntry++; }
      assert( nEntry==idx );
    }

    /* Verify that the every entry in the mapping region is reachable
    ** via the hash table.  This turns out to be a really, really expensive
    ** thing to check, so only do this occasionally - not on every
    ** iteration.
    */
    if( (idx&0x3ff)==0 ){
      int i;           /* Loop counter */
      for(i=1; i<=idx; i++){
        for(iKey=walHash(aPgno[i]); aHash[iKey]; iKey=walNextHash(iKey)){
          if( aHash[iKey]==i ) break;
        }
        assert( aHash[iKey]==i );
      }
    }
#endif /* SQLITE_ENABLE_EXPENSIVE_ASSERT */
  }


  return rc;
}